

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

deInt32 tcu::getPositionOfIEEEFloatWithoutDenormals(float x)

{
  bool bVar1;
  deInt32 dVar2;
  StorageType_conflict SVar3;
  Float<unsigned_int,_8,_23,_127,_3U> local_14;
  float local_10;
  Float32 f;
  float x_local;
  
  if ((x != 0.0) || (NAN(x))) {
    local_10 = x;
    if (0.0 <= x) {
      Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_14,x);
      bVar1 = Float<unsigned_int,_8,_23,_127,_3U>::isDenorm(&local_14);
      if (bVar1) {
        f.m_value = 0;
      }
      else {
        SVar3 = Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_14);
        f.m_value = SVar3 - 0x7fffff;
      }
    }
    else {
      dVar2 = getPositionOfIEEEFloatWithoutDenormals(-x);
      f.m_value = -dVar2;
    }
  }
  else {
    f.m_value = 0;
  }
  return f.m_value;
}

Assistant:

static deInt32 getPositionOfIEEEFloatWithoutDenormals (float x)
{
	DE_ASSERT(!deIsNaN(x)); // not sane

	if (x == 0.0f)
		return 0;
	else if (x < 0.0f)
		return -getPositionOfIEEEFloatWithoutDenormals(-x);
	else
	{
		DE_ASSERT(x > 0.0f);

		const tcu::Float32 f(x);

		if (f.isDenorm())
		{
			// Denorms are flushed to zero
			return 0;
		}
		else
		{
			// sign is 0, and it's a normal number. Natural position is its bit
			// pattern but since we've collapsed the denorms, we must remove
			// the gap here too to keep the float enumeration continuous.
			//
			// Denormals occupy one exponent pattern. Removing one from
			// exponent should to the trick. Add one since the removed range
			// contained one representable value, 0.
			return (deInt32)(f.bits() - (1u << 23u) + 1u);
		}
	}
}